

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

char * dedotdotify(char *input,size_t clen)

{
  char *pcVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *__s;
  size_t sVar7;
  char *pcVar8;
  char *__dest;
  
  pcVar6 = (char *)(*Curl_cmalloc)(clen + 1);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    *pcVar6 = '\0';
    if (*input != '\0') {
      __s = strchr(input,0x3f);
      __dest = pcVar6;
      do {
        if (*input == '/') {
          iVar5 = strncmp("/./",input,3);
          if (iVar5 == 0) {
LAB_005bbdf4:
            input = input + 2;
            goto LAB_005bbe15;
          }
          iVar5 = strcmp("/.",input);
          if ((iVar5 != 0) && (iVar5 = strncmp("/.?",input,3), iVar5 != 0)) {
            iVar5 = strncmp("/../",input,4);
            if (iVar5 == 0) {
              input = input + 3;
              pcVar8 = __dest;
              do {
                __dest = pcVar8;
                if (pcVar8 <= pcVar6) break;
                __dest = pcVar8 + -1;
                pcVar1 = pcVar8 + -1;
                pcVar8 = __dest;
              } while (*pcVar1 != '/');
              *__dest = '\0';
              bVar3 = true;
              goto LAB_005bbe18;
            }
            iVar5 = strcmp("/..",input);
            pcVar8 = __dest;
            if ((iVar5 != 0) && (iVar5 = strncmp("/..?",input,4), iVar5 != 0)) goto LAB_005bbddc;
            do {
              __dest = pcVar8;
              if (pcVar8 <= pcVar6) break;
              __dest = pcVar8 + -1;
              pcVar1 = pcVar8 + -1;
              pcVar8 = __dest;
            } while (*pcVar1 != '/');
          }
          *__dest = '/';
          __dest = __dest + 1;
          bVar4 = false;
          pcVar8 = __dest;
LAB_005bbe40:
          *pcVar8 = '\0';
        }
        else {
          if (*input == '.') {
            iVar5 = strncmp("./",input,2);
            if (iVar5 == 0) goto LAB_005bbdf4;
            iVar5 = strncmp("../",input,3);
            if (iVar5 != 0) {
              iVar5 = strcmp(".",input);
              pcVar8 = pcVar6;
              if (((iVar5 == 0) || (iVar5 = strcmp("..",input), iVar5 == 0)) ||
                 (iVar5 = strncmp(".?",input,2), iVar5 == 0)) {
                bVar4 = false;
              }
              else {
                iVar5 = strncmp("..?",input,3);
                bVar3 = false;
                bVar4 = false;
                if (iVar5 != 0) goto LAB_005bbe18;
              }
              goto LAB_005bbe40;
            }
            input = input + 3;
LAB_005bbe15:
            bVar3 = true;
          }
          else {
LAB_005bbddc:
            bVar3 = false;
          }
LAB_005bbe18:
          bVar4 = true;
          if (!bVar3) {
            do {
              do {
                *__dest = *input;
                pbVar2 = (byte *)(input + 1);
                input = input + 1;
                __dest = __dest + 1;
              } while (0x3f < (ulong)*pbVar2);
            } while ((0x8000800000000001U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0);
            bVar4 = true;
            pcVar8 = __dest;
            goto LAB_005bbe40;
          }
        }
        if (!bVar4) {
LAB_005bbe89:
          if (__s == (char *)0x0) {
            return pcVar6;
          }
          sVar7 = strlen(__s);
          memcpy(__dest,__s,sVar7 + 1);
          return pcVar6;
        }
        if ((*input == '\0') || (__s != (char *)0x0 && __s <= input)) goto LAB_005bbe89;
      } while( true );
    }
  }
  return pcVar6;
}

Assistant:

UNITTEST char *dedotdotify(const char *input, size_t clen)
{
  char *out = malloc(clen + 1);
  char *outptr;
  const char *orginput = input;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  if(!*input)
    /* zero length input string, return that */
    return out;

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(input, '?');

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A.  If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D.  if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C.  if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of input string OR, if there is a terminating
       query part, stop there */
  } while(*input && (!queryp || (input < queryp)));

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. */
    size_t oindex = queryp - orginput;
    qlen = strlen(&orginput[oindex]);
    memcpy(outptr, &orginput[oindex], qlen + 1); /* include zero byte */
  }

  return out;
}